

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O3

bool __thiscall aeron::archive::ArchiveProxy::offer(ArchiveProxy *this,int32_t length)

{
  char *pcVar1;
  long lVar2;
  SourcedException *pSVar3;
  char *pcVar4;
  bool bVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  iVar7 = this->retryAttempts_;
  lVar2 = ExclusivePublication::offer
                    ((this->publication_).
                     super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&this->buffer_,0,length + 8,
                     (on_reserved_value_supplier_t *)
                     concurrent::logbuffer::DEFAULT_RESERVED_VALUE_SUPPLIER);
  bVar5 = true;
  if (lVar2 < 1) {
    iVar7 = iVar7 + 1;
    do {
      if (lVar2 == -5) {
        pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"offer failed due to max position being reached","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)","");
        pcVar6 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
        ;
        pcVar4 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
        do {
          pcVar4 = pcVar4 + 1;
          pcVar1 = pcVar6 + 1;
          pcVar6 = pcVar6 + 1;
        } while (*pcVar4 == *pcVar1);
        std::__cxx11::string::string((string *)&local_50,pcVar6 + (*pcVar1 == '/'),&local_91);
        aeron::util::SourcedException::SourcedException(pSVar3,&local_90,&local_70,&local_50,0x114);
        *(undefined ***)pSVar3 = &PTR__SourcedException_001642b8;
        __cxa_throw(pSVar3,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
      if (lVar2 == -1) {
        pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"connection to the archive is no longer available","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)","");
        pcVar6 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
        ;
        pcVar4 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
        do {
          pcVar4 = pcVar4 + 1;
          pcVar1 = pcVar6 + 1;
          pcVar6 = pcVar6 + 1;
        } while (*pcVar4 == *pcVar1);
        std::__cxx11::string::string((string *)&local_50,pcVar6 + (*pcVar1 == '/'),&local_91);
        aeron::util::SourcedException::SourcedException(pSVar3,&local_90,&local_70,&local_50,0x112);
        *(undefined ***)pSVar3 = &PTR__SourcedException_001642b8;
        __cxa_throw(pSVar3,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
      if (lVar2 == -4) {
        pSVar3 = (SourcedException *)__cxa_allocate_exception(0x48);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"connection to the archive has been closed","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)","");
        pcVar6 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
        ;
        pcVar4 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
        do {
          pcVar4 = pcVar4 + 1;
          pcVar1 = pcVar6 + 1;
          pcVar6 = pcVar6 + 1;
        } while (*pcVar4 == *pcVar1);
        std::__cxx11::string::string((string *)&local_50,pcVar6 + (*pcVar1 == '/'),&local_91);
        aeron::util::SourcedException::SourcedException(pSVar3,&local_90,&local_70,&local_50,0x110);
        *(undefined ***)pSVar3 = &PTR__SourcedException_001642b8;
        __cxa_throw(pSVar3,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
      iVar8 = iVar7 + -1;
      bVar5 = 1 < iVar8;
      if (SBORROW4(iVar8,2) != iVar7 + -3 < 0) {
        return bVar5;
      }
      sched_yield();
      lVar2 = ExclusivePublication::offer
                        ((this->publication_).
                         super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,&this->buffer_,0,length + 8,
                         (on_reserved_value_supplier_t *)
                         concurrent::logbuffer::DEFAULT_RESERVED_VALUE_SUPPLIER);
      iVar7 = iVar8;
    } while (lVar2 < 1);
  }
  return bVar5;
}

Assistant:

bool ArchiveProxy::offer(std::int32_t length) {
    std::int32_t attempts = retryAttempts_;
    while (true) {
        std::int64_t result = publication_->offer(buffer_, 0, codecs::MessageHeader::encodedLength() + length);
        if (result > 0) {
            return true;
        }

        if (result == aeron::PUBLICATION_CLOSED) {
            throw ArchiveException("connection to the archive has been closed", SOURCEINFO);
        } else if (result == aeron::NOT_CONNECTED) {
            throw ArchiveException("connection to the archive is no longer available", SOURCEINFO);
        } else if (result == aeron::MAX_POSITION_EXCEEDED) {
            throw ArchiveException("offer failed due to max position being reached", SOURCEINFO);
        }

        if (--attempts <= 0) {
            return false;
        }

        idle_.idle();
    }
}